

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void __thiscall Fl_Widget_Type::write_properties(Fl_Widget_Type *this)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  Fl_Image *pFVar4;
  byte bVar6;
  Fl_Type *pFVar7;
  uchar uVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fl_Widget *pFVar11;
  char *pcVar12;
  int n;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Fl_Color c;
  int s;
  Fl_Color fc;
  int fs;
  Fl_Font ff;
  Fl_Font f;
  
  Fl_Type::write_properties(&this->super_Fl_Type);
  write_indent((this->super_Fl_Type).level + 1);
  if (this->public_ == 0) {
    pcVar12 = "private";
LAB_001898f2:
    write_string(pcVar12);
  }
  else if (this->public_ == 2) {
    pcVar12 = "protected";
    goto LAB_001898f2;
  }
  if ((this->tooltip_ != (char *)0x0) && (*this->tooltip_ != '\0')) {
    write_string("tooltip");
    write_word(this->tooltip_);
  }
  if ((this->image_name_ != (char *)0x0) && (*this->image_name_ != '\0')) {
    write_string("image");
    write_word(this->image_name_);
  }
  if ((this->inactive_name_ != (char *)0x0) && (*this->inactive_name_ != '\0')) {
    write_string("deimage");
    write_word(this->inactive_name_);
  }
  pFVar11 = this->o;
  write_string("xywh {%d %d %d %d}",(ulong)(uint)pFVar11->x_,(ulong)(uint)pFVar11->y_,
               (ulong)(uint)pFVar11->w_,(ulong)(uint)pFVar11->h_);
  pFVar7 = (this->super_Fl_Type).factory[1].prev;
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
  if ((iVar9 == 0) ||
     (lVar13 = 0x134, *(char *)((long)&this->o[2].label_.deimage + 4) == pFVar7[2].rtti)) {
    lVar13 = 0x6c;
    if (this->o->type_ != (uchar)pFVar7->header_position) goto LAB_001899f0;
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
    if (iVar9 != 0) goto LAB_001899f0;
  }
  else {
LAB_001899f0:
    write_string("type");
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2c])(this);
    pcVar12 = item_name((Fl_Menu_Item *)CONCAT44(extraout_var,iVar9),
                        (uint)*(byte *)((long)&this->o->_vptr_Fl_Widget + lVar13));
    write_word(pcVar12);
  }
  if (this->o->box_ != *(uchar *)((long)&pFVar7->header_position + 2)) {
    write_string("box");
    pcVar12 = boxname((uint)this->o->box_);
    write_word(pcVar12);
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])(this);
  if ((iVar9 != 0) && (*(int *)((long)&this->o[1].label_.value + 4) != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])(this);
  if ((iVar9 != 0) && (this->o[2].color_ != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])(this);
  if ((iVar9 != 0) && (this->o[3].w_ != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
  if (iVar9 == 0) {
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])(this);
    iVar9 = strcmp((char *)CONCAT44(extraout_var_00,iVar9),"Fl_Input_Choice");
    if (iVar9 == 0) {
      pFVar11 = this->o;
      if (pFVar11[1].label_.value[0x89] == '\0') goto LAB_00189bf0;
      write_string("down_box");
      bVar6 = pFVar11[1].label_.value[0x89];
    }
    else {
      iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])(this);
      if ((iVar9 == 0) || (pFVar11 = this->o, *(char *)((long)&pFVar11[1].callback_ + 1) == '\0'))
      goto LAB_00189bf0;
      write_string("down_box");
      bVar6 = *(byte *)((long)&pFVar11[1].callback_ + 1);
    }
    pcVar12 = boxname((uint)bVar6);
    write_word(pcVar12);
  }
  else {
    pFVar11 = this->o;
    if (*(char *)((long)&pFVar11[1]._vptr_Fl_Widget + 6) != '\0') {
      write_string("down_box");
      pcVar12 = boxname((uint)*(byte *)((long)&pFVar11[1]._vptr_Fl_Widget + 6));
      write_word(pcVar12);
    }
    if (*(int *)&pFVar11[1]._vptr_Fl_Widget != 0) {
      write_string("shortcut 0x%x");
    }
    if (*(char *)((long)&pFVar11[1]._vptr_Fl_Widget + 4) != '\0') {
      write_string("value 1");
    }
  }
LAB_00189bf0:
  pFVar11 = this->o;
  if (pFVar11->color_ != *(Fl_Color *)((long)&pFVar7->factory + 4)) {
    write_string("color %d");
    pFVar11 = this->o;
  }
  if (pFVar11->color2_ != pFVar7->code_position) {
    write_string("selection_color %d");
    pFVar11 = this->o;
  }
  if ((pFVar11->label_).type != *(uchar *)&pFVar7->prev) {
    write_string("labeltype");
    pcVar12 = item_name(labeltypemenu,(uint)(this->o->label_).type);
    write_word(pcVar12);
    pFVar11 = this->o;
  }
  if ((pFVar11->label_).font != pFVar7->level) {
    write_string("labelfont %d");
    pFVar11 = this->o;
  }
  if ((pFVar11->label_).size != *(int *)&pFVar7->field_0x4c) {
    write_string("labelsize %d");
    pFVar11 = this->o;
  }
  if ((pFVar11->label_).color != *(Fl_Color *)&pFVar7->next) {
    write_string("labelcolor %d");
    pFVar11 = this->o;
  }
  if ((pFVar11->label_).align_ != *(Fl_Align *)((long)&pFVar7->next + 4)) {
    write_string("align %d");
    pFVar11 = this->o;
  }
  if (pFVar11->when_ != *(uchar *)((long)&pFVar7->header_position + 3)) {
    write_string("when %d");
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
  if (iVar9 != 0) {
    pFVar11 = this->o;
    if (((double)pFVar11[1].callback_ != (double)pFVar7[1].label_) ||
       (NAN((double)pFVar11[1].callback_) || NAN((double)pFVar7[1].label_))) {
      write_string("minimum %g");
    }
    if (((double)pFVar11[1].user_data_ != (double)pFVar7[1].callback_) ||
       (NAN((double)pFVar11[1].user_data_) || NAN((double)pFVar7[1].callback_))) {
      write_string("maximum %g");
    }
    uVar3 = pFVar11[1].x_;
    uVar5 = pFVar11[1].y_;
    auVar15._4_4_ = uVar5;
    auVar15._0_4_ = uVar3;
    auVar15._8_8_ = pFVar7[1].user_data_;
    auVar16._8_4_ = SUB84((double)*(int *)&pFVar7[1].user_data_type_,0);
    auVar16._0_8_ = (double)pFVar11[1].w_;
    auVar16._12_4_ = (int)((ulong)(double)*(int *)&pFVar7[1].user_data_type_ >> 0x20);
    auVar16 = divpd(auVar15,auVar16);
    if ((auVar16._0_8_ != auVar16._8_8_) || (NAN(auVar16._0_8_) || NAN(auVar16._8_8_))) {
      write_string("step %g");
    }
    if (((double)pFVar11[1]._vptr_Fl_Widget != 0.0) || (NAN((double)pFVar11[1]._vptr_Fl_Widget))) {
      write_string("value %g");
    }
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
    if (1 < iVar9) {
      fVar2 = (float)pFVar11[1].h_;
      pfVar1 = (float *)((long)&pFVar7[1].user_data_type_ + 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        write_string("slider_size %g",(double)fVar2);
      }
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
  if (iVar9 != 0) {
    pFVar11 = this->o;
    pcVar12 = pFVar11[1].label_.value;
    if (((double)pcVar12 != (double)pFVar7[1].comment_) ||
       (NAN((double)pcVar12) || NAN((double)pFVar7[1].comment_))) {
      write_string("minimum %g");
    }
    pFVar4 = pFVar11[1].label_.image;
    if (((double)pFVar4 != (double)pFVar7[1].parent) ||
       (NAN((double)pFVar4) || NAN((double)pFVar7[1].parent))) {
      write_string("maximum %g");
    }
    pFVar4 = pFVar11[1].label_.deimage;
    if (((double)pFVar4 != *(double *)&pFVar7[1].new_selected) ||
       (NAN((double)pFVar4) || NAN(*(double *)&pFVar7[1].new_selected))) {
      write_string("step %g");
    }
    if ((*(double *)&pFVar11[1].w_ != 1.0) || (NAN(*(double *)&pFVar11[1].w_))) {
      write_string("value %g");
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,4,&ff,&fs,&fc);
  if (iVar9 != 0) {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,0,&f,&s,&c);
    if (f != ff) {
      write_string("textfont %d");
    }
    if (s != fs) {
      write_string("textsize %d");
    }
    if (c != fc) {
      write_string("textcolor %d");
    }
  }
  uVar10 = this->o->flags_;
  if ((uVar10 & 2) != 0) {
    write_string("hide");
    uVar10 = this->o->flags_;
  }
  if ((uVar10 & 1) != 0) {
    write_string("deactivate");
  }
  uVar8 = resizable(this);
  if (uVar8 != '\0') {
    write_string("resizable");
  }
  if (this->hotspot_ != '\0') {
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this);
    pcVar12 = "divider";
    if (iVar9 == 0) {
      pcVar12 = "hotspot";
    }
    write_string(pcVar12);
  }
  for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
    if (this->extra_code_[uVar14] != (char *)0x0) {
      write_indent((this->super_Fl_Type).level + 1);
      write_string("code%d",uVar14 & 0xffffffff);
      write_word(this->extra_code_[uVar14]);
    }
  }
  if (this->subclass_ != (char *)0x0) {
    write_indent((this->super_Fl_Type).level + 1);
    write_string("class");
    write_word(this->subclass_);
  }
  return;
}

Assistant:

void Fl_Widget_Type::write_properties() {
  Fl_Type::write_properties();
  write_indent(level+1);
  switch (public_) {
    case 0: write_string("private"); break;
    case 1: break;
    case 2: write_string("protected"); break;
  }
  if (tooltip() && *tooltip()) {
    write_string("tooltip");
    write_word(tooltip());
  }
  if (image_name() && *image_name()) {
    write_string("image");
    write_word(image_name());
  }
  if (inactive_name() && *inactive_name()) {
    write_string("deimage");
    write_word(inactive_name());
  }
  write_string("xywh {%d %d %d %d}", o->x(), o->y(), o->w(), o->h());
  Fl_Widget* tplate = ((Fl_Widget_Type*)factory)->o;
  if (is_spinner() && ((Fl_Spinner*)o)->type() != ((Fl_Spinner*)tplate)->type()) {
    write_string("type");
    write_word(item_name(subtypes(), ((Fl_Spinner*)o)->type()));
  } else if (o->type() != tplate->type() || is_window()) {
    write_string("type");
    write_word(item_name(subtypes(), o->type()));
  }
  if (o->box() != tplate->box()) {
    write_string("box"); write_word(boxname(o->box()));}
  if (is_input()) {
    Fl_Input_* b = (Fl_Input_*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_value_input()) {
    Fl_Value_Input* b = (Fl_Value_Input*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_text_display()) {
    Fl_Text_Display* b = (Fl_Text_Display*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_button()) {
    Fl_Button* b = (Fl_Button*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
    if (b->value()) write_string("value 1");
  } else if (!strcmp(type_name(), "Fl_Input_Choice")) {
    Fl_Input_Choice* b = (Fl_Input_Choice*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
  } else if (is_menu_button()) {
    Fl_Menu_* b = (Fl_Menu_*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
  }
  if (o->color()!=tplate->color())
    write_string("color %d", o->color());
  if (o->selection_color()!=tplate->selection_color())
    write_string("selection_color %d", o->selection_color());
  if (o->labeltype()!=tplate->labeltype()) {
    write_string("labeltype");
    write_word(item_name(labeltypemenu, o->labeltype()));
  }
  if (o->labelfont()!=tplate->labelfont())
    write_string("labelfont %d", o->labelfont());
  if (o->labelsize()!=tplate->labelsize())
    write_string("labelsize %d", o->labelsize());
  if (o->labelcolor()!=tplate->labelcolor())
    write_string("labelcolor %d", o->labelcolor());
  if (o->align()!=tplate->align())
    write_string("align %d", o->align());
  if (o->when() != tplate->when())
    write_string("when %d", o->when());
  if (is_valuator()) {
    Fl_Valuator* v = (Fl_Valuator*)o;
    Fl_Valuator* f = (Fl_Valuator*)(tplate);
    if (v->minimum()!=f->minimum()) write_string("minimum %g",v->minimum());
    if (v->maximum()!=f->maximum()) write_string("maximum %g",v->maximum());
    if (v->step()!=f->step()) write_string("step %g",v->step());
    if (v->value()!=0.0) write_string("value %g",v->value());
    if (is_valuator()>=2) {
      double x = ((Fl_Slider*)v)->slider_size();
      double y = ((Fl_Slider*)f)->slider_size();
      if (x != y) write_string("slider_size %g", x);
    }
  }
  if (is_spinner()) {
    Fl_Spinner* v = (Fl_Spinner*)o;
    Fl_Spinner* f = (Fl_Spinner*)(tplate);
    if (v->minimum()!=f->minimum()) write_string("minimum %g",v->minimum());
    if (v->maximum()!=f->maximum()) write_string("maximum %g",v->maximum());
    if (v->step()!=f->step()) write_string("step %g",v->step());
    if (v->value()!=1.0) write_string("value %g",v->value());
  }
  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_string("textfont %d", f);
    if (s != fs) write_string("textsize %d", s);
    if (c != fc) write_string("textcolor %d", c);
  }}
  if (!o->visible()) write_string("hide");
  if (!o->active()) write_string("deactivate");
  if (resizable()) write_string("resizable");
  if (hotspot()) write_string(is_menu_item() ? "divider" : "hotspot");
  for (int n=0; n < NUM_EXTRA_CODE; n++) if (extra_code(n)) {
    write_indent(level+1);
    write_string("code%d",n);
    write_word(extra_code(n));
  }
  if (subclass()) {
    write_indent(level+1);
    write_string("class");
    write_word(subclass());
  }
}